

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

void __thiscall
CVmObjClass::CVmObjClass(CVmObjClass *this,int in_root_set,uint meta_idx,vm_obj_id_t self)

{
  vm_intcls_ext *pvVar1;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0035f678;
  (this->super_CVmObject).ext_ = (char *)0x0;
  pvVar1 = alloc_ext(this);
  pvVar1->meta_idx = meta_idx;
  pvVar1->mod_obj = 0;
  (pvVar1->class_state).typ = VM_NIL;
  pvVar1->changed = 0;
  register_meta(this,self);
  return;
}

Assistant:

CVmObjClass::CVmObjClass(VMG_ int in_root_set, uint meta_idx,
                         vm_obj_id_t self)
{
    /* calls of this form can't come from the image file */
    assert(!in_root_set);

    /* allocate the extension */
    ext_ = 0;
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* set up the extension */
    ext->meta_idx = meta_idx;
    ext->mod_obj = VM_INVALID_OBJ;
    ext->class_state.set_nil();
    ext->changed = FALSE;

    /* register myself with the metaclass table */
    register_meta(vmg_ self);
}